

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

size_t __thiscall
google::protobuf::internal::ExtensionSet::Extension::ByteSize(Extension *this,int number)

{
  bool bVar1;
  FieldType FVar2;
  int iVar3;
  uint uVar4;
  LogMessage *other;
  size_t sVar5;
  size_t sVar6;
  int *piVar7;
  uint *puVar8;
  undefined4 extraout_var;
  Type *pTVar9;
  long *plVar10;
  ulong *puVar11;
  unsigned_long *puVar12;
  Type *pTVar13;
  long lVar14;
  ulong uVar15;
  int i_7;
  RepeatedField<unsigned_int> *this_00;
  RepeatedField<int> *pRVar16;
  RepeatedField<long> *pRVar17;
  RepeatedField<unsigned_long> *this_01;
  string *psVar18;
  int i;
  int iVar19;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (this->is_repeated == true) {
    bVar1 = this->is_packed;
    FVar2 = anon_unknown_29::real_type(this->type);
    if (bVar1 != true) {
      sVar6 = WireFormatLite::TagSize(number,FVar2);
      FVar2 = anon_unknown_29::real_type(this->type);
      switch(FVar2) {
      case TYPE_DOUBLE:
      case TYPE_FIXED64:
      case TYPE_SFIXED64:
        lVar14 = sVar6 + 8;
        break;
      case TYPE_FLOAT:
      case TYPE_FIXED32:
      case TYPE_SFIXED32:
        lVar14 = sVar6 + 4;
        break;
      case TYPE_INT64:
        pRVar17 = (this->field_0).repeated_int64_value;
        uVar15 = (ulong)(uint)pRVar17->current_size_;
        sVar6 = sVar6 * uVar15;
        for (iVar19 = 0; iVar19 < (int)uVar15; iVar19 = iVar19 + 1) {
          puVar11 = (ulong *)RepeatedField<long>::Get(pRVar17,iVar19);
          lVar14 = 0x3f;
          if ((*puVar11 | 1) != 0) {
            for (; (*puVar11 | 1) >> lVar14 == 0; lVar14 = lVar14 + -1) {
            }
          }
          sVar6 = sVar6 + ((int)lVar14 * 9 + 0x49U >> 6);
          pRVar17 = (this->field_0).repeated_int64_value;
          uVar15 = (ulong)(uint)pRVar17->current_size_;
        }
        return sVar6;
      case TYPE_UINT64:
        this_01 = (this->field_0).repeated_uint64_value;
        uVar15 = (ulong)(uint)this_01->current_size_;
        sVar6 = sVar6 * uVar15;
        for (iVar19 = 0; iVar19 < (int)uVar15; iVar19 = iVar19 + 1) {
          puVar12 = RepeatedField<unsigned_long>::Get(this_01,iVar19);
          lVar14 = 0x3f;
          if ((*puVar12 | 1) != 0) {
            for (; (*puVar12 | 1) >> lVar14 == 0; lVar14 = lVar14 + -1) {
            }
          }
          sVar6 = sVar6 + ((int)lVar14 * 9 + 0x49U >> 6);
          this_01 = (this->field_0).repeated_uint64_value;
          uVar15 = (ulong)(uint)this_01->current_size_;
        }
        return sVar6;
      case TYPE_INT32:
        pRVar16 = (this->field_0).repeated_int32_value;
        uVar15 = (ulong)(uint)pRVar16->current_size_;
        sVar6 = sVar6 * uVar15;
        for (iVar19 = 0; iVar19 < (int)uVar15; iVar19 = iVar19 + 1) {
          piVar7 = RepeatedField<int>::Get(pRVar16,iVar19);
          sVar5 = io::CodedOutputStream::VarintSize32SignExtended(*piVar7);
          sVar6 = sVar6 + sVar5;
          pRVar16 = (this->field_0).repeated_int32_value;
          uVar15 = (ulong)(uint)pRVar16->current_size_;
        }
        return sVar6;
      case TYPE_BOOL:
        lVar14 = sVar6 + 1;
        break;
      case TYPE_STRING:
        psVar18 = (this->field_0).string_value;
        uVar15 = (ulong)(uint)psVar18->_M_string_length;
        sVar6 = sVar6 * uVar15;
        for (iVar19 = 0; iVar19 < (int)uVar15; iVar19 = iVar19 + 1) {
          pTVar13 = RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                              ((RepeatedPtrFieldBase *)psVar18,iVar19);
          sVar5 = WireFormatLite::StringSize(pTVar13);
          sVar6 = sVar6 + sVar5;
          psVar18 = (this->field_0).string_value;
          uVar15 = (ulong)(uint)psVar18->_M_string_length;
        }
        return sVar6;
      case TYPE_GROUP:
        psVar18 = (this->field_0).string_value;
        uVar15 = (ulong)(uint)psVar18->_M_string_length;
        sVar6 = sVar6 * uVar15;
        for (iVar19 = 0; iVar19 < (int)uVar15; iVar19 = iVar19 + 1) {
          pTVar9 = RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                             ((RepeatedPtrFieldBase *)psVar18,iVar19);
          iVar3 = (*pTVar9->_vptr_MessageLite[0xc])(pTVar9);
          sVar6 = sVar6 + CONCAT44(extraout_var,iVar3);
          psVar18 = (this->field_0).string_value;
          uVar15 = (ulong)(uint)psVar18->_M_string_length;
        }
        return sVar6;
      case TYPE_MESSAGE:
        psVar18 = (this->field_0).string_value;
        uVar15 = (ulong)(uint)psVar18->_M_string_length;
        sVar6 = sVar6 * uVar15;
        for (iVar19 = 0; iVar19 < (int)uVar15; iVar19 = iVar19 + 1) {
          pTVar9 = RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                             ((RepeatedPtrFieldBase *)psVar18,iVar19);
          sVar5 = WireFormatLite::MessageSize(pTVar9);
          sVar6 = sVar6 + sVar5;
          psVar18 = (this->field_0).string_value;
          uVar15 = (ulong)(uint)psVar18->_M_string_length;
        }
        return sVar6;
      case TYPE_BYTES:
        psVar18 = (this->field_0).string_value;
        uVar15 = (ulong)(uint)psVar18->_M_string_length;
        sVar6 = sVar6 * uVar15;
        for (iVar19 = 0; iVar19 < (int)uVar15; iVar19 = iVar19 + 1) {
          pTVar13 = RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                              ((RepeatedPtrFieldBase *)psVar18,iVar19);
          sVar5 = WireFormatLite::BytesSize(pTVar13);
          sVar6 = sVar6 + sVar5;
          psVar18 = (this->field_0).string_value;
          uVar15 = (ulong)(uint)psVar18->_M_string_length;
        }
        return sVar6;
      case TYPE_UINT32:
        this_00 = (this->field_0).repeated_uint32_value;
        uVar15 = (ulong)(uint)this_00->current_size_;
        sVar6 = sVar6 * uVar15;
        for (iVar19 = 0; iVar19 < (int)uVar15; iVar19 = iVar19 + 1) {
          puVar8 = RepeatedField<unsigned_int>::Get(this_00,iVar19);
          iVar3 = 0x1f;
          if ((*puVar8 | 1) != 0) {
            for (; (*puVar8 | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
            }
          }
          sVar6 = sVar6 + (iVar3 * 9 + 0x49U >> 6);
          this_00 = (this->field_0).repeated_uint32_value;
          uVar15 = (ulong)(uint)this_00->current_size_;
        }
        return sVar6;
      case TYPE_ENUM:
        pRVar16 = (this->field_0).repeated_int32_value;
        uVar15 = (ulong)(uint)pRVar16->current_size_;
        sVar6 = sVar6 * uVar15;
        for (iVar19 = 0; iVar19 < (int)uVar15; iVar19 = iVar19 + 1) {
          piVar7 = RepeatedField<int>::Get(pRVar16,iVar19);
          sVar5 = io::CodedOutputStream::VarintSize32SignExtended(*piVar7);
          sVar6 = sVar6 + sVar5;
          pRVar16 = (this->field_0).repeated_int32_value;
          uVar15 = (ulong)(uint)pRVar16->current_size_;
        }
        return sVar6;
      case TYPE_SINT32:
        pRVar16 = (this->field_0).repeated_int32_value;
        uVar15 = (ulong)(uint)pRVar16->current_size_;
        sVar6 = sVar6 * uVar15;
        for (iVar19 = 0; iVar19 < (int)uVar15; iVar19 = iVar19 + 1) {
          piVar7 = RepeatedField<int>::Get(pRVar16,iVar19);
          sVar5 = WireFormatLite::SInt32Size(*piVar7);
          sVar6 = sVar6 + sVar5;
          pRVar16 = (this->field_0).repeated_int32_value;
          uVar15 = (ulong)(uint)pRVar16->current_size_;
        }
        return sVar6;
      case MAX_FIELD_TYPE:
        pRVar17 = (this->field_0).repeated_int64_value;
        uVar15 = (ulong)(uint)pRVar17->current_size_;
        sVar6 = sVar6 * uVar15;
        for (iVar19 = 0; iVar19 < (int)uVar15; iVar19 = iVar19 + 1) {
          plVar10 = RepeatedField<long>::Get(pRVar17,iVar19);
          sVar5 = WireFormatLite::SInt64Size(*plVar10);
          sVar6 = sVar6 + sVar5;
          pRVar17 = (this->field_0).repeated_int64_value;
          uVar15 = (ulong)(uint)pRVar17->current_size_;
        }
        return sVar6;
      default:
        return 0;
      }
      return lVar14 * (ulong)(uint)((this->field_0).repeated_int32_value)->current_size_;
    }
    switch(FVar2) {
    case TYPE_DOUBLE:
    case TYPE_FIXED64:
    case TYPE_SFIXED64:
      uVar15 = (ulong)(uint)((this->field_0).repeated_int32_value)->current_size_ << 3;
      break;
    case TYPE_FLOAT:
    case TYPE_FIXED32:
    case TYPE_SFIXED32:
      uVar15 = (ulong)(uint)((this->field_0).repeated_int32_value)->current_size_ << 2;
      break;
    case TYPE_INT64:
      uVar15 = 0;
      for (iVar19 = 0; iVar19 < ((this->field_0).repeated_int64_value)->current_size_;
          iVar19 = iVar19 + 1) {
        puVar11 = (ulong *)RepeatedField<long>::Get((this->field_0).repeated_int64_value,iVar19);
        lVar14 = 0x3f;
        if ((*puVar11 | 1) != 0) {
          for (; (*puVar11 | 1) >> lVar14 == 0; lVar14 = lVar14 + -1) {
          }
        }
        uVar15 = uVar15 + ((int)lVar14 * 9 + 0x49U >> 6);
      }
      break;
    case TYPE_UINT64:
      uVar15 = 0;
      for (iVar19 = 0; iVar19 < ((this->field_0).repeated_uint64_value)->current_size_;
          iVar19 = iVar19 + 1) {
        puVar12 = RepeatedField<unsigned_long>::Get((this->field_0).repeated_uint64_value,iVar19);
        lVar14 = 0x3f;
        if ((*puVar12 | 1) != 0) {
          for (; (*puVar12 | 1) >> lVar14 == 0; lVar14 = lVar14 + -1) {
          }
        }
        uVar15 = uVar15 + ((int)lVar14 * 9 + 0x49U >> 6);
      }
      break;
    case TYPE_INT32:
      uVar15 = 0;
      for (iVar19 = 0; iVar19 < ((this->field_0).repeated_int32_value)->current_size_;
          iVar19 = iVar19 + 1) {
        piVar7 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,iVar19);
        sVar6 = io::CodedOutputStream::VarintSize32SignExtended(*piVar7);
        uVar15 = uVar15 + sVar6;
      }
      break;
    case TYPE_BOOL:
      uVar15 = (ulong)(uint)((this->field_0).repeated_int32_value)->current_size_;
      break;
    case TYPE_STRING:
    case TYPE_GROUP:
    case TYPE_MESSAGE:
    case TYPE_BYTES:
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x62d);
      other = LogMessage::operator<<(&local_60,"Non-primitive types can\'t be packed.");
      LogFinisher::operator=(&local_61,other);
      LogMessage::~LogMessage(&local_60);
    default:
      this->cached_size = 0;
      return 0;
    case TYPE_UINT32:
      uVar15 = 0;
      for (iVar19 = 0; iVar19 < ((this->field_0).repeated_uint32_value)->current_size_;
          iVar19 = iVar19 + 1) {
        puVar8 = RepeatedField<unsigned_int>::Get((this->field_0).repeated_uint32_value,iVar19);
        iVar3 = 0x1f;
        if ((*puVar8 | 1) != 0) {
          for (; (*puVar8 | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        uVar15 = uVar15 + (iVar3 * 9 + 0x49U >> 6);
      }
      break;
    case TYPE_ENUM:
      uVar15 = 0;
      for (iVar19 = 0; iVar19 < ((this->field_0).repeated_int32_value)->current_size_;
          iVar19 = iVar19 + 1) {
        piVar7 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,iVar19);
        sVar6 = io::CodedOutputStream::VarintSize32SignExtended(*piVar7);
        uVar15 = uVar15 + sVar6;
      }
      break;
    case TYPE_SINT32:
      uVar15 = 0;
      for (iVar19 = 0; iVar19 < ((this->field_0).repeated_int32_value)->current_size_;
          iVar19 = iVar19 + 1) {
        piVar7 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,iVar19);
        sVar6 = WireFormatLite::SInt32Size(*piVar7);
        uVar15 = uVar15 + sVar6;
      }
      break;
    case MAX_FIELD_TYPE:
      uVar15 = 0;
      for (iVar19 = 0; iVar19 < ((this->field_0).repeated_int64_value)->current_size_;
          iVar19 = iVar19 + 1) {
        plVar10 = RepeatedField<long>::Get((this->field_0).repeated_int64_value,iVar19);
        sVar6 = WireFormatLite::SInt64Size(*plVar10);
        uVar15 = uVar15 + sVar6;
      }
    }
    this->cached_size = (uint)uVar15;
    if (uVar15 == 0) {
      return 0;
    }
    uVar4 = (uint)uVar15 | 1;
    iVar19 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar19 == 0; iVar19 = iVar19 + -1) {
      }
    }
    sVar6 = (size_t)(iVar19 * 9 + 0x49U >> 6);
    uVar4 = number * 8 + 3;
    iVar19 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar19 == 0; iVar19 = iVar19 + -1) {
      }
    }
    sVar5 = uVar15 + (iVar19 * 9 + 0x49U >> 6);
    goto LAB_00617a25;
  }
  if ((this->field_0xa & 1) != 0) {
    return 0;
  }
  FVar2 = anon_unknown_29::real_type(this->type);
  sVar5 = WireFormatLite::TagSize(number,FVar2);
  FVar2 = anon_unknown_29::real_type(this->type);
  switch(FVar2) {
  case TYPE_DOUBLE:
  case TYPE_FIXED64:
  case TYPE_SFIXED64:
    return sVar5 + 8;
  case TYPE_FLOAT:
  case TYPE_FIXED32:
  case TYPE_SFIXED32:
    return sVar5 + 4;
  case TYPE_INT64:
  case TYPE_UINT64:
    uVar15 = (this->field_0).uint64_value | 1;
    lVar14 = 0x3f;
    if (uVar15 != 0) {
      for (; uVar15 >> lVar14 == 0; lVar14 = lVar14 + -1) {
      }
    }
    iVar19 = (int)lVar14;
    goto LAB_00617a1c;
  case TYPE_INT32:
  case TYPE_ENUM:
    sVar6 = io::CodedOutputStream::VarintSize32SignExtended((this->field_0).int32_value);
    break;
  case TYPE_BOOL:
    return sVar5 + 1;
  case TYPE_STRING:
    sVar6 = WireFormatLite::StringSize((this->field_0).string_value);
    break;
  case TYPE_GROUP:
    sVar6 = (**(code **)((((this->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).
                         arena_ + 0x60))();
    break;
  case TYPE_MESSAGE:
    if ((this->field_0xa & 0x10) != 0) {
      uVar4 = (*((this->field_0).message_value)->_vptr_MessageLite[10])();
      sVar5 = sVar5 + (long)(int)uVar4;
      goto LAB_00617a16;
    }
    sVar6 = WireFormatLite::MessageSize((this->field_0).message_value);
    break;
  case TYPE_BYTES:
    sVar6 = WireFormatLite::BytesSize((this->field_0).string_value);
    break;
  case TYPE_UINT32:
    uVar4 = (this->field_0).uint32_value;
LAB_00617a16:
    iVar19 = 0x1f;
    if ((uVar4 | 1) != 0) {
      for (; (uVar4 | 1) >> iVar19 == 0; iVar19 = iVar19 + -1) {
      }
    }
LAB_00617a1c:
    sVar6 = (size_t)(iVar19 * 9 + 0x49U >> 6);
    break;
  case TYPE_SINT32:
    sVar6 = WireFormatLite::SInt32Size((this->field_0).int32_value);
    break;
  case MAX_FIELD_TYPE:
    sVar6 = WireFormatLite::SInt64Size((this->field_0).int64_value);
    break;
  default:
    goto switchD_00617575_default;
  }
LAB_00617a25:
  sVar5 = sVar5 + sVar6;
switchD_00617575_default:
  return sVar5;
}

Assistant:

size_t ExtensionSet::Extension::ByteSize(int number) const {
  size_t result = 0;

  if (is_repeated) {
    if (is_packed) {
      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case WireFormatLite::TYPE_##UPPERCASE:                              \
          for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) {  \
            result += WireFormatLite::CAMELCASE##Size(                      \
              repeated_##LOWERCASE##_value->Get(i));                        \
          }                                                                 \
          break

        HANDLE_TYPE(   INT32,    Int32,   int32);
        HANDLE_TYPE(   INT64,    Int64,   int64);
        HANDLE_TYPE(  UINT32,   UInt32,  uint32);
        HANDLE_TYPE(  UINT64,   UInt64,  uint64);
        HANDLE_TYPE(  SINT32,   SInt32,   int32);
        HANDLE_TYPE(  SINT64,   SInt64,   int64);
        HANDLE_TYPE(    ENUM,     Enum,    enum);
#undef HANDLE_TYPE

        // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case WireFormatLite::TYPE_##UPPERCASE:                              \
          result += WireFormatLite::k##CAMELCASE##Size *                    \
                    FromIntSize(repeated_##LOWERCASE##_value->size());      \
          break
        HANDLE_TYPE( FIXED32,  Fixed32, uint32);
        HANDLE_TYPE( FIXED64,  Fixed64, uint64);
        HANDLE_TYPE(SFIXED32, SFixed32,  int32);
        HANDLE_TYPE(SFIXED64, SFixed64,  int64);
        HANDLE_TYPE(   FLOAT,    Float,  float);
        HANDLE_TYPE(  DOUBLE,   Double, double);
        HANDLE_TYPE(    BOOL,     Bool,   bool);
#undef HANDLE_TYPE

        case WireFormatLite::TYPE_STRING:
        case WireFormatLite::TYPE_BYTES:
        case WireFormatLite::TYPE_GROUP:
        case WireFormatLite::TYPE_MESSAGE:
          GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
          break;
      }

      cached_size = ToCachedSize(result);
      if (result > 0) {
        result += io::CodedOutputStream::VarintSize32(result);
        result += io::CodedOutputStream::VarintSize32(
            WireFormatLite::MakeTag(number,
                WireFormatLite::WIRETYPE_LENGTH_DELIMITED));
      }
    } else {
      size_t tag_size = WireFormatLite::TagSize(number, real_type(type));

      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case WireFormatLite::TYPE_##UPPERCASE:                              \
          result += tag_size *                                              \
                    FromIntSize(repeated_##LOWERCASE##_value->size());      \
          for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) {  \
            result += WireFormatLite::CAMELCASE##Size(                      \
              repeated_##LOWERCASE##_value->Get(i));                        \
          }                                                                 \
          break

        HANDLE_TYPE(   INT32,    Int32,   int32);
        HANDLE_TYPE(   INT64,    Int64,   int64);
        HANDLE_TYPE(  UINT32,   UInt32,  uint32);
        HANDLE_TYPE(  UINT64,   UInt64,  uint64);
        HANDLE_TYPE(  SINT32,   SInt32,   int32);
        HANDLE_TYPE(  SINT64,   SInt64,   int64);
        HANDLE_TYPE(  STRING,   String,  string);
        HANDLE_TYPE(   BYTES,    Bytes,  string);
        HANDLE_TYPE(    ENUM,     Enum,    enum);
        HANDLE_TYPE(   GROUP,    Group, message);
        HANDLE_TYPE( MESSAGE,  Message, message);
#undef HANDLE_TYPE

        // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case WireFormatLite::TYPE_##UPPERCASE:                              \
          result += (tag_size + WireFormatLite::k##CAMELCASE##Size) *       \
                    FromIntSize(repeated_##LOWERCASE##_value->size());      \
          break
        HANDLE_TYPE( FIXED32,  Fixed32, uint32);
        HANDLE_TYPE( FIXED64,  Fixed64, uint64);
        HANDLE_TYPE(SFIXED32, SFixed32,  int32);
        HANDLE_TYPE(SFIXED64, SFixed64,  int64);
        HANDLE_TYPE(   FLOAT,    Float,  float);
        HANDLE_TYPE(  DOUBLE,   Double, double);
        HANDLE_TYPE(    BOOL,     Bool,   bool);
#undef HANDLE_TYPE
      }
    }
  } else if (!is_cleared) {
    result += WireFormatLite::TagSize(number, real_type(type));
    switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                      \
      case WireFormatLite::TYPE_##UPPERCASE:                              \
        result += WireFormatLite::CAMELCASE##Size(LOWERCASE);             \
        break

      HANDLE_TYPE(   INT32,    Int32,    int32_value);
      HANDLE_TYPE(   INT64,    Int64,    int64_value);
      HANDLE_TYPE(  UINT32,   UInt32,   uint32_value);
      HANDLE_TYPE(  UINT64,   UInt64,   uint64_value);
      HANDLE_TYPE(  SINT32,   SInt32,    int32_value);
      HANDLE_TYPE(  SINT64,   SInt64,    int64_value);
      HANDLE_TYPE(  STRING,   String,  *string_value);
      HANDLE_TYPE(   BYTES,    Bytes,  *string_value);
      HANDLE_TYPE(    ENUM,     Enum,     enum_value);
      HANDLE_TYPE(   GROUP,    Group, *message_value);
#undef HANDLE_TYPE
      case WireFormatLite::TYPE_MESSAGE: {
        if (is_lazy) {
          size_t size = lazymessage_value->ByteSize();
          result += io::CodedOutputStream::VarintSize32(size) + size;
        } else {
          result += WireFormatLite::MessageSize(*message_value);
        }
        break;
      }

      // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE)                                 \
      case WireFormatLite::TYPE_##UPPERCASE:                              \
        result += WireFormatLite::k##CAMELCASE##Size;                     \
        break
      HANDLE_TYPE( FIXED32,  Fixed32);
      HANDLE_TYPE( FIXED64,  Fixed64);
      HANDLE_TYPE(SFIXED32, SFixed32);
      HANDLE_TYPE(SFIXED64, SFixed64);
      HANDLE_TYPE(   FLOAT,    Float);
      HANDLE_TYPE(  DOUBLE,   Double);
      HANDLE_TYPE(    BOOL,     Bool);
#undef HANDLE_TYPE
    }
  }

  return result;
}